

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  long lVar2;
  pointer pOVar3;
  pointer pAVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  const_iterator __begin3;
  pointer pOVar15;
  long lVar16;
  pointer pAVar17;
  bool bVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ParserInfo parseInfos [512];
  undefined1 local_2160 [64];
  char *local_2120;
  size_type local_2118;
  char local_2110;
  undefined7 uStack_210f;
  undefined8 uStack_2108;
  string *local_2100;
  undefined1 local_20f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e8;
  undefined1 local_20c8 [16];
  undefined1 auStack_20b8 [24];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_20a0;
  undefined1 *local_2088 [2];
  undefined1 local_2078 [16];
  ParserResult local_2068;
  ulong local_2038 [1025];
  undefined1 auVar21 [16];
  
  pOVar15 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar4 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar17 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = local_2038;
  lVar16 = 0;
  local_2100 = exeName;
  memset(puVar12,0,0x2000);
  local_20e8.field_2._8_8_ = (long)pOVar3 - (long)pOVar15;
  if (local_20e8.field_2._8_8_ != 0) {
    lVar16 = 0;
    do {
      lVar16 = lVar16 + 1;
      *puVar12 = (ulong)pOVar15;
      pOVar15 = pOVar15 + 1;
      puVar12 = puVar12 + 2;
    } while (pOVar15 != pOVar3);
  }
  lVar2 = (long)pAVar4 - (long)pAVar17;
  if (lVar2 != 0) {
    uVar11 = lVar2 - 0x60;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar11;
    uVar20 = SUB164(auVar26 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar23 = (undefined4)(uVar11 / 0x180000000);
    auVar21._0_8_ = CONCAT44(uVar23,uVar20);
    auVar21._8_4_ = uVar20;
    auVar21._12_4_ = uVar23;
    auVar22._0_8_ = auVar21._0_8_ >> 6;
    auVar22._8_8_ = auVar21._8_8_ >> 6;
    puVar12 = local_2038 + lVar16 * 2 + 2;
    uVar14 = 0;
    auVar22 = auVar22 ^ _DAT_0019f0c0;
    do {
      auVar24._8_4_ = (int)pAVar17;
      auVar24._0_8_ = pAVar17;
      auVar24._12_4_ = (int)((ulong)pAVar17 >> 0x20);
      auVar25._8_4_ = (int)uVar14;
      auVar25._0_8_ = uVar14;
      auVar25._12_4_ = (int)(uVar14 >> 0x20);
      auVar26 = (auVar25 | _DAT_0019f0b0) ^ _DAT_0019f0c0;
      if ((bool)(~(auVar26._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar26._0_4_ ||
                  auVar22._4_4_ < auVar26._4_4_) & 1)) {
        puVar12[-2] = (ulong)pAVar17;
      }
      if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
          auVar26._12_4_ <= auVar22._12_4_) {
        *puVar12 = auVar24._8_8_ + 0x60;
      }
      uVar14 = uVar14 + 2;
      pAVar17 = pAVar17 + 2;
      puVar12 = puVar12 + 4;
    } while ((uVar11 / 0x60 + 2 & 0xfffffffffffffffe) != uVar14);
  }
  ExeName::set(&local_2068,&this->m_exeName,local_2100);
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c67e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p);
  }
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001c6840;
  this_00 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
            (auStack_20b8 + 8);
  local_20c8._0_4_ = 1;
  local_20c8._8_8_ = (tokens->it)._M_current;
  auStack_20b8._0_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (this_00,&tokens->m_tokenBuffer);
  local_2160._8_4_ = Ok;
  local_2160._0_8_ = &PTR__ResultValueBase_001c66e0;
  local_2160._16_4_ = local_20c8._0_4_;
  local_2160._24_8_ = local_20c8._8_8_;
  local_2160._32_8_ = auStack_20b8._0_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2160 + 0x28),this_00);
  uVar11 = (lVar2 >> 5) * -0x5555555555555555 +
           ((long)local_20e8.field_2._8_8_ >> 3) * -0x1111111111111111;
  local_2160._0_8_ = &PTR__BasicResult_001c6688;
  local_2120 = &local_2110;
  local_2118 = 0;
  local_2110 = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (this_00);
  do {
    (**(_func_int **)(local_2160._0_8_ + 0x10))
              ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2160);
    local_20c8._0_8_ = local_2160._24_8_;
    local_20c8._8_8_ = local_2160._32_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2160 + 0x28));
    uVar10 = auStack_20b8._8_8_;
    uVar9 = auStack_20b8._0_8_;
    uVar8 = local_20c8._8_8_;
    uVar7 = local_20c8._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8);
    if ((uVar9 == uVar10) && (uVar7 == uVar8)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2160._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001c66e0;
      if (local_2160._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_2160._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2160._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2160._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2160 + 0x28));
      }
LAB_00180e22:
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c6688;
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_2120 == &local_2110) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_210f,local_2110);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2108;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2120;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_210f,local_2110);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2118;
      local_2118 = 0;
      local_2110 = '\0';
      local_2120 = &local_2110;
      goto LAB_00180e74;
    }
    if (uVar11 == 0) {
      bVar18 = false;
    }
    else {
      bVar18 = true;
      puVar12 = local_2038 + 1;
      uVar14 = 1;
      do {
        plVar5 = (long *)puVar12[-1];
        lVar16 = (**(code **)(*plVar5 + 0x20))(plVar5);
        if ((lVar16 == 0) ||
           (uVar6 = *puVar12, uVar13 = (**(code **)(*plVar5 + 0x20))(plVar5), uVar6 < uVar13)) {
          (**(_func_int **)(local_2160._0_8_ + 0x10))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2160);
          local_20f8._0_8_ = local_2160._24_8_;
          local_20f8._8_8_ = local_2160._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_20f8 + 0x10),
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2160 + 0x28));
          (**(code **)(*plVar5 + 0x18))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8,plVar5,
                     local_2100,local_20f8);
          ResultValueBase<Catch::clara::detail::ParseState>::operator=
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2160,
                     (ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8);
          ::std::__cxx11::string::operator=((string *)&local_2120,(string *)local_2088);
          local_20c8._0_8_ = &PTR__BasicResult_001c6688;
          if (local_2088[0] != local_2078) {
            operator_delete(local_2088[0]);
          }
          local_20c8._0_8_ = &PTR__ResultValueBase_001c66e0;
          if (local_20c8._8_4_ == Ok) {
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_20a0);
          }
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)(local_20f8 + 0x10));
          if (local_2160._8_4_ != Ok) {
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase.m_type = local_2160._8_4_;
            goto LAB_00180e22;
          }
          (**(_func_int **)(local_2160._0_8_ + 0x10))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2160);
          if (local_2160._16_4_ != NoMatch) {
            *puVar12 = *puVar12 + 1;
            goto LAB_00180d4f;
          }
        }
        bVar18 = uVar14 < uVar11;
        puVar12 = puVar12 + 2;
        bVar19 = uVar14 != uVar11;
        uVar14 = uVar14 + 1;
      } while (bVar19);
      bVar18 = false;
    }
LAB_00180d4f:
    (**(_func_int **)(local_2160._0_8_ + 0x10))
              ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2160);
    if (local_2160._16_4_ == ShortCircuitAll) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2160._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001c66e0;
      if (local_2160._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = ShortCircuitAll;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2160._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2160._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2160 + 0x28));
      }
      goto LAB_00180e22;
    }
  } while (bVar18);
  (**(_func_int **)(local_2160._0_8_ + 0x10))();
  local_20c8._0_8_ = local_2160._24_8_;
  local_20c8._8_8_ = local_2160._32_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             auStack_20b8,
             (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2160 + 0x28));
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20f8,
                   "Unrecognised token: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_20b8._0_8_ + 8));
  BasicResult<Catch::clara::detail::ParseState>::BasicResult
            (__return_storage_ptr__,RuntimeError,(string *)local_20f8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20f8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_20f8 + 0x10)) {
    operator_delete((void *)local_20f8._0_8_);
  }
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             auStack_20b8);
  local_2160._0_8_ = &PTR__BasicResult_001c6688;
  if (local_2120 != &local_2110) {
    operator_delete(local_2120);
  }
LAB_00180e74:
  local_2160._0_8_ = &PTR__ResultValueBase_001c66e0;
  if (local_2160._8_4_ == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2160 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }